

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void prefixIterSetupTokendataCb(Fts5Index *p,void *pCtx,Fts5Iter *p1,u8 *pNew,int nNew)

{
  int iVar1;
  long in_FS_OFFSET;
  i64 iPos;
  int iPosOff;
  i64 local_40;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  local_40 = 0;
  if (pNew != (u8 *)0x0) {
    *(u32 *)((long)pCtx + 0xc) = nNew - 1U;
    *(undefined4 *)((long)pCtx + 8) = *(undefined4 *)(*pCtx + 0x18);
    sqlite3Fts5BufferAppendBlob(&p->rc,(Fts5Buffer *)(*pCtx + 0x10),nNew - 1U,pNew + 1);
  }
  while( true ) {
    iVar1 = sqlite3Fts5PoslistNext64((p1->base).pData,(p1->base).nData,&local_34,&local_40);
    if (iVar1 != 0) break;
    fts5TokendataIterAppendMap
              (p,*pCtx,*(int *)((long)pCtx + 8),*(int *)((long)pCtx + 0xc),(p1->base).iRowid,
               local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void prefixIterSetupTokendataCb(
  Fts5Index *p,
  void *pCtx,
  Fts5Iter *p1,
  const u8 *pNew,
  int nNew
){
  TokendataSetupCtx *pSetup = (TokendataSetupCtx*)pCtx;
  int iPosOff = 0;
  i64 iPos = 0;

  if( pNew ){
    pSetup->nTermByte = nNew-1;
    pSetup->iTermOff = pSetup->pT->terms.n;
    fts5BufferAppendBlob(&p->rc, &pSetup->pT->terms, nNew-1, pNew+1);
  }

  while( 0==sqlite3Fts5PoslistNext64(
     p1->base.pData, p1->base.nData, &iPosOff, &iPos
  ) ){
    fts5TokendataIterAppendMap(p,
        pSetup->pT, pSetup->iTermOff, pSetup->nTermByte, p1->base.iRowid, iPos
    );
  }
}